

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O2

void * __thiscall cppnet::PoolAlloter::ChunkAlloc(PoolAlloter *this,uint32_t size,uint32_t *nums)

{
  element_type *peVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  
  pcVar5 = this->_pool_start;
  pcVar4 = this->_pool_end;
  do {
    uVar6 = *nums * size;
    uVar2 = (int)pcVar4 - (int)pcVar5;
    if (uVar6 <= uVar2) {
LAB_001108f6:
      this->_pool_start = pcVar5 + uVar6;
      return pcVar5;
    }
    if (size <= uVar2) {
      *nums = uVar2 / size;
      uVar6 = (uVar2 / size) * size;
      goto LAB_001108f6;
    }
    if (uVar2 != 0) {
      *(MemNode **)pcVar5 =
           (this->_free_list).
           super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
           ._M_impl.super__Vector_impl_data._M_start[(uVar2 + 7 >> 3) - 1];
      (this->_free_list).
      super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start[(size + 7 >> 3) - 1] = (MemNode *)this->_pool_start;
    }
    peVar1 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    iVar3 = (*peVar1->_vptr_Alloter[2])(peVar1,(ulong)uVar6);
    this->_pool_start = (char *)CONCAT44(extraout_var,iVar3);
    std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->_malloc_vec,&this->_pool_start);
    pcVar5 = this->_pool_start;
    pcVar4 = pcVar5 + uVar6;
    this->_pool_end = pcVar4;
  } while( true );
}

Assistant:

void* PoolAlloter::ChunkAlloc(uint32_t size, uint32_t& nums) {
    char* res;
    uint32_t need_bytes = size * nums;
    uint32_t left_bytes = uint32_t(_pool_end - _pool_start);

    //pool is enough
    if (left_bytes >= need_bytes) {
        res = _pool_start;
        _pool_start += need_bytes;
        return res;
    
    } else if (left_bytes >= size) {
        nums = left_bytes / size;
        need_bytes = size * nums;
        res = _pool_start;
        _pool_start += need_bytes;
        return res;

    } 
    uint32_t bytes_to_get = size * nums;

    if (left_bytes > 0) {
        MemNode* my_free = _free_list[FreeListIndex(left_bytes)];
        ((MemNode*)_pool_start)->_next = my_free;
        _free_list[FreeListIndex(size)] = (MemNode*)_pool_start;
    }

    _pool_start = (char*)_alloter->Malloc(bytes_to_get);

    _malloc_vec.push_back(_pool_start);
    _pool_end = _pool_start + bytes_to_get;
    return ChunkAlloc(size, nums);
}